

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLSplineLoader.cpp
# Opt level: O0

bool __thiscall COLLADASaxFWL::SplineLoader::end__spline(SplineLoader *this)

{
  long in_RDI;
  SplineLoader *in_stack_00000028;
  SplineLoader *in_stack_00000248;
  
  *(undefined1 *)(in_RDI + 0x131) = 0;
  loadPositions(in_stack_00000248);
  loadOutTangents(in_stack_00000248);
  loadInTangents(in_stack_00000248);
  loadInterpolations(in_stack_00000028);
  FilePartLoader::finish((FilePartLoader *)0xb38607);
  return true;
}

Assistant:

bool SplineLoader::end__spline()
    {
        mInSpline = false;

        loadPositions();
        loadOutTangents();
        loadInTangents();
        loadInterpolations();

        // The mesh will be written by the GeometyLoader. Therefore nothing to with the mesh here
        finish();
        return true;
    }